

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O0

ostream * spvtools::utils::operator<<
                    (ostream *os,
                    HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
                    *value)

{
  _Setfill<char> _Var1;
  uint uVar2;
  fmtflags __fmtfl;
  _Setw _Var3;
  char *pcVar4;
  ostream *poVar5;
  void *this;
  bool bVar6;
  bool bVar7;
  char local_52;
  fmtflags local_50;
  int iStack_3c;
  char_type saved_fill;
  fmtflags saved_flags;
  uint_type fraction_nibbles;
  int_type int_exponent;
  bool is_denorm;
  bool is_zero;
  uint_type fraction;
  uint_type exponent;
  char *sign;
  HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
  *pHStack_18;
  uint_type bits;
  HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
  *value_local;
  ostream *os_local;
  
  pHStack_18 = value;
  value_local = (HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
                 *)os;
  sign._0_4_ = HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
               ::value(value);
  sign._4_4_ = FloatProxy<float>::data((FloatProxy<float> *)&sign);
  pcVar4 = "";
  if ((sign._4_4_ & 0x80000000) != 0) {
    pcVar4 = "-";
  }
  uVar2 = (sign._4_4_ & 0x7f800000) >> 0x17;
  int_exponent = (sign._4_4_ & 0x7fffff) << 1;
  bVar6 = uVar2 != 0;
  bVar7 = (sign._4_4_ & 0x7fffff) != 0;
  local_50 = uVar2 + ~(_S_oct|_S_left|_S_internal|_S_hex|_S_fixed|_S_dec);
  if (!bVar6 && !bVar7) {
    local_50 = ~(_S_ios_fmtflags_min|_S_ios_fmtflags_max);
  }
  saved_flags = local_50;
  if (uVar2 == 0 && (bVar6 || bVar7)) {
    for (; (int_exponent & 0x800000U) == 0; int_exponent = int_exponent << 1) {
      saved_flags = saved_flags + (_S_ios_fmtflags_min|_S_ios_fmtflags_max);
    }
    int_exponent = (int_exponent & 0x7fffffU) << 1;
  }
  for (iStack_3c = 6; iStack_3c != 0 && (int_exponent & 0xfU) == 0; iStack_3c = iStack_3c + -1) {
    int_exponent = (uint)int_exponent >> 4;
  }
  __fmtfl = std::ios_base::flags
                      ((ios_base *)
                       ((long)&(value_local->value_).data_ + *(long *)(*(long *)value_local + -0x18)
                       ));
  std::ios::fill();
  poVar5 = std::operator<<((ostream *)value_local,pcVar4);
  poVar5 = std::operator<<(poVar5,"0x");
  local_52 = '0';
  if (bVar6 || bVar7) {
    local_52 = '1';
  }
  std::operator<<(poVar5,local_52);
  if (iStack_3c != 0) {
    poVar5 = std::operator<<((ostream *)value_local,".");
    _Var3 = std::setw(iStack_3c);
    poVar5 = std::operator<<(poVar5,_Var3);
    _Var1 = std::setfill<char>('0');
    poVar5 = std::operator<<(poVar5,_Var1._M_c);
    this = (void *)std::ostream::operator<<(poVar5,std::hex);
    std::ostream::operator<<(this,int_exponent);
  }
  poVar5 = std::operator<<((ostream *)value_local,"p");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::dec);
  pcVar4 = "";
  if ((_S_ios_fmtflags_min|_S_ios_fmtflags_max) < saved_flags) {
    pcVar4 = "+";
  }
  poVar5 = std::operator<<(poVar5,pcVar4);
  std::ostream::operator<<(poVar5,saved_flags);
  std::ios_base::flags
            ((ios_base *)
             ((long)&(value_local->value_).data_ + *(long *)(*(long *)value_local + -0x18)),__fmtfl)
  ;
  std::ios::fill((char)value_local + (char)*(undefined8 *)(*(long *)value_local + -0x18));
  return (ostream *)value_local;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const HexFloat<T, Traits>& value) {
  using HF = HexFloat<T, Traits>;
  using uint_type = typename HF::uint_type;
  using int_type = typename HF::int_type;

  static_assert(HF::num_used_bits != 0,
                "num_used_bits must be non-zero for a valid float");
  static_assert(HF::num_exponent_bits != 0,
                "num_exponent_bits must be non-zero for a valid float");
  static_assert(HF::num_fraction_bits != 0,
                "num_fractin_bits must be non-zero for a valid float");

  const uint_type bits = value.value().data();
  const char* const sign = (bits & HF::sign_mask) ? "-" : "";
  const uint_type exponent = static_cast<uint_type>(
      (bits & HF::exponent_mask) >> HF::num_fraction_bits);

  uint_type fraction = static_cast<uint_type>((bits & HF::fraction_encode_mask)
                                              << HF::num_overflow_bits);

  const bool is_zero = exponent == 0 && fraction == 0;
  const bool is_denorm = exponent == 0 && !is_zero;

  // exponent contains the biased exponent we have to convert it back into
  // the normal range.
  int_type int_exponent = static_cast<int_type>(exponent - HF::exponent_bias);
  // If the number is all zeros, then we actually have to NOT shift the
  // exponent.
  int_exponent = is_zero ? 0 : int_exponent;

  // If we are denorm, then start shifting, and decreasing the exponent until
  // our leading bit is 1.

  if (is_denorm) {
    while ((fraction & HF::fraction_top_bit) == 0) {
      fraction = static_cast<uint_type>(fraction << 1);
      int_exponent = static_cast<int_type>(int_exponent - 1);
    }
    // Since this is denormalized, we have to consume the leading 1 since it
    // will end up being implicit.
    fraction = static_cast<uint_type>(fraction << 1);  // eat the leading 1
    fraction &= HF::fraction_represent_mask;
  }

  uint_type fraction_nibbles = HF::fraction_nibbles;
  // We do not have to display any trailing 0s, since this represents the
  // fractional part.
  while (fraction_nibbles > 0 && (fraction & 0xF) == 0) {
    // Shift off any trailing values;
    fraction = static_cast<uint_type>(fraction >> 4);
    --fraction_nibbles;
  }

  const auto saved_flags = os.flags();
  const auto saved_fill = os.fill();

  os << sign << "0x" << (is_zero ? '0' : '1');
  if (fraction_nibbles) {
    // Make sure to keep the leading 0s in place, since this is the fractional
    // part.
    os << "." << std::setw(static_cast<int>(fraction_nibbles))
       << std::setfill('0') << std::hex << fraction;
  }
  os << "p" << std::dec << (int_exponent >= 0 ? "+" : "") << int_exponent;

  os.flags(saved_flags);
  os.fill(saved_fill);

  return os;
}